

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  uchar uVar1;
  ulong __n;
  bool bVar2;
  stbi_uc sVar3;
  byte bVar4;
  stbi_uc sVar5;
  stbi_uc sVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  bool bVar16;
  uint uVar17;
  int iVar18;
  char *pcVar19;
  uint *puVar20;
  uint uVar21;
  uchar *puVar22;
  uint x_00;
  stbi_uc *out;
  uint c;
  uint uVar23;
  uint uVar24;
  int iVar25;
  uint *puVar26;
  int z;
  ulong uVar27;
  int iVar28;
  long in_FS_OFFSET;
  bool bVar29;
  bool bVar30;
  uchar raw_data [4];
  uint local_7c;
  stbi_uc local_6c [4];
  uint *local_68;
  stbi_uc *local_60;
  uint *local_58;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_68 = (uint *)y;
  local_58 = (uint *)x;
  local_4c = req_comp;
  sVar3 = stbi__get8(s);
  local_60 = (stbi_uc *)CONCAT71(local_60._1_7_,sVar3);
  sVar3 = stbi__get8(s);
  bVar4 = stbi__get8(s);
  sVar5 = stbi__get8(s);
  sVar6 = stbi__get8(s);
  bVar7 = stbi__get8(s);
  bVar8 = stbi__get8(s);
  bVar9 = stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  bVar10 = stbi__get8(s);
  bVar11 = stbi__get8(s);
  bVar12 = stbi__get8(s);
  bVar13 = stbi__get8(s);
  bVar14 = stbi__get8(s);
  bVar15 = stbi__get8(s);
  local_6c[0] = '\0';
  local_6c[1] = '\0';
  local_6c[2] = '\0';
  local_6c[3] = '\0';
  if (sVar3 == '\0') {
    if (bVar14 < 0x10) {
      if (bVar14 == 8) {
LAB_00186e35:
        bVar30 = true;
        bVar2 = false;
        bVar9 = 1;
        goto LAB_00186e69;
      }
      if (bVar14 == 0xf) goto LAB_00186e22;
    }
    else {
      bVar9 = bVar14;
      if ((bVar14 == 0x20) || (bVar14 == 0x18)) goto LAB_00186e57;
      if (bVar14 == 0x10) {
        uVar17 = bVar4 - 8;
        if (bVar4 < 8) {
          uVar17 = (uint)bVar4;
        }
        if (uVar17 != 3) goto LAB_00186e22;
        bVar9 = 2;
        goto LAB_00186e5b;
      }
    }
LAB_00186e48:
    pcVar19 = "Can\'t find out TGA pixelformat";
    goto LAB_0018704c;
  }
  if (bVar9 < 0x18) {
    if (1 < bVar9 - 0xf) {
      if (bVar9 == 8) goto LAB_00186e35;
      goto LAB_00186e48;
    }
LAB_00186e22:
    bVar9 = 3;
    bVar2 = true;
    bVar30 = false;
  }
  else {
    if ((bVar9 != 0x18) && (bVar9 != 0x20)) goto LAB_00186e48;
LAB_00186e57:
    bVar9 = bVar9 >> 3;
LAB_00186e5b:
    bVar30 = true;
    bVar2 = false;
  }
LAB_00186e69:
  local_38 = (ulong)bVar10;
  x_00 = (uint)bVar11 * 0x100 + (uint)bVar10;
  local_40 = (ulong)bVar12;
  local_48 = (ulong)((uint)bVar13 * 0x100);
  uVar17 = (uint)bVar13 * 0x100 + (uint)bVar12;
  c = (uint)bVar9;
  *local_58 = x_00;
  *local_68 = uVar17;
  if (comp != (int *)0x0) {
    *comp = c;
  }
  iVar18 = stbi__mad3sizes_valid(x_00,uVar17,c,0);
  if (iVar18 != 0) {
    local_68 = (uint *)stbi__malloc_mad3(x_00,uVar17,c,0);
    if (local_68 == (uint *)0x0) {
LAB_00187045:
      pcVar19 = "Out of memory";
      goto LAB_0018704c;
    }
    stbi__skip(s,(uint)(byte)local_60);
    puVar20 = local_68;
    if ((bVar4 < 8 && sVar3 == '\0') && !bVar2) {
      if (uVar17 != 0) {
        iVar18 = (int)local_48 + (int)local_40;
        iVar28 = 0;
        do {
          iVar18 = iVar18 + -1;
          iVar25 = iVar28;
          if ((bVar15 >> 5 & 1) == 0) {
            iVar25 = iVar18;
          }
          stbi__getn(s,(stbi_uc *)((long)puVar20 + (long)(int)(iVar25 * x_00 * c)),x_00 * c);
          iVar28 = iVar28 + 1;
        } while (iVar18 != 0);
      }
      goto LAB_00187293;
    }
    uVar23 = (uint)bVar8 * 0x100 + (uint)bVar7;
    if (sVar3 == '\0') {
      local_60 = (stbi_uc *)0x0;
      puVar20 = (uint *)local_60;
    }
    else {
      if (uVar23 == 0) {
LAB_0018702d:
        free(puVar20);
        goto LAB_00187032;
      }
      stbi__skip(s,(uint)CONCAT11(sVar6,sVar5));
      puVar20 = (uint *)stbi__malloc_mad2(uVar23,c,0);
      if (puVar20 == (uint *)0x0) {
        free(local_68);
        goto LAB_00187045;
      }
      if (bVar30) {
        iVar18 = stbi__getn(s,(stbi_uc *)puVar20,uVar23 * c);
        if (iVar18 == 0) {
          free(local_68);
          goto LAB_0018702d;
        }
      }
      else {
        if (c != 3) {
          __assert_fail("tga_comp == STBI_rgb",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/flowkey[P]sdl-gpu/src/externals/stb_image/stb_image.h"
                        ,0x1746,
                        "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                       );
        }
        uVar21 = (uint)CONCAT11(bVar8,bVar7);
        out = (stbi_uc *)puVar20;
        do {
          stbi__tga_read_rgb16(s,out);
          out = out + 3;
          uVar21 = uVar21 - 1;
        } while (uVar21 != 0);
      }
    }
    local_60 = (stbi_uc *)puVar20;
    if (uVar17 * x_00 != 0) {
      __n = (ulong)c;
      local_58 = (uint *)(ulong)(uVar17 * x_00);
      bVar16 = true;
      puVar20 = (uint *)0x0;
      local_7c = 0;
      iVar18 = 0;
      do {
        if (bVar4 < 8) {
LAB_00187114:
          if (sVar3 == '\0') {
            if (!bVar30) {
              if (c != 3) {
                __assert_fail("tga_comp == STBI_rgb",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/flowkey[P]sdl-gpu/src/externals/stb_image/stb_image.h"
                              ,0x1777,
                              "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                             );
              }
              stbi__tga_read_rgb16(s,local_6c);
              goto LAB_001871d0;
            }
            if (c != 0) {
              uVar27 = 0;
              do {
                sVar5 = stbi__get8(s);
                local_6c[uVar27] = sVar5;
                uVar27 = uVar27 + 1;
              } while (__n != uVar27);
              goto LAB_001871a7;
            }
          }
          else {
            bVar7 = stbi__get8(s);
            uVar21 = (uint)bVar7;
            if (bVar14 != 8) {
              sVar5 = stbi__get8(s);
              uVar21 = (uint)CONCAT11(sVar5,bVar7);
            }
            if (c != 0) {
              if (uVar23 <= uVar21) {
                uVar21 = 0;
              }
              memcpy(local_6c,local_60 + uVar21 * c,__n);
LAB_001871d0:
              memcpy((stbi_uc *)((long)local_68 + (ulong)(c * (int)puVar20)),local_6c,__n);
            }
          }
        }
        else {
          if (iVar18 == 0) {
            bVar7 = stbi__get8(s);
            iVar18 = (bVar7 & 0x7f) + 1;
            local_7c = (uint)(bVar7 >> 7);
            goto LAB_00187114;
          }
          bVar29 = local_7c != 0;
          local_7c = 1;
          if (!bVar29 || bVar16) {
            local_7c = (uint)bVar29;
            goto LAB_00187114;
          }
LAB_001871a7:
          if (c != 0) goto LAB_001871d0;
        }
        iVar18 = iVar18 + -1;
        puVar20 = (uint *)((long)puVar20 + 1);
        bVar16 = false;
      } while (puVar20 != local_58);
    }
    puVar20 = local_68;
    if (uVar17 != 0 && (bVar15 >> 5 & 1) == 0) {
      iVar18 = x_00 * c;
      uVar21 = ((int)local_40 + (int)local_48) - 1;
      iVar28 = ((uint)bVar11 * 0x100 | (uint)local_38) * uVar21 * c;
      uVar24 = 0;
      uVar23 = 0;
      do {
        if (iVar18 != 0) {
          puVar26 = local_68;
          iVar25 = iVar18 + 1;
          do {
            sVar3 = *(stbi_uc *)((long)puVar26 + (ulong)uVar24);
            *(stbi_uc *)((long)puVar26 + (ulong)uVar24) = *(stbi_uc *)((long)puVar26 + (long)iVar28)
            ;
            *(stbi_uc *)((long)puVar26 + (long)iVar28) = sVar3;
            puVar26 = (uint *)((long)puVar26 + 1);
            iVar25 = iVar25 + -1;
          } while (1 < iVar25);
        }
        iVar28 = iVar28 - iVar18;
        uVar24 = uVar24 + iVar18;
        bVar30 = uVar23 != uVar21 >> 1;
        uVar23 = uVar23 + 1;
      } while (bVar30);
    }
    if (local_60 != (stbi_uc *)0x0) {
      free(local_60);
    }
LAB_00187293:
    if ((!bVar2 && 2 < bVar9) && (iVar18 = uVar17 * x_00, iVar18 != 0)) {
      puVar22 = (uchar *)((long)puVar20 + 2);
      do {
        uVar1 = puVar22[-2];
        puVar22[-2] = *puVar22;
        *puVar22 = uVar1;
        puVar22 = puVar22 + c;
        iVar18 = iVar18 + -1;
      } while (iVar18 != 0);
    }
    if (c == local_4c || local_4c == 0) {
      return (uchar *)puVar20;
    }
    puVar22 = stbi__convert_format((uchar *)puVar20,c,local_4c,x_00,uVar17);
    return puVar22;
  }
LAB_00187032:
  pcVar19 = "Corrupt TGA";
LAB_0018704c:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar19;
  return (void *)0x0;
}

Assistant:

static void *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4] = {0};
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;
   STBI_NOTUSED(ri);
   STBI_NOTUSED(tga_x_origin); // @TODO
   STBI_NOTUSED(tga_y_origin); // @TODO

   if (tga_height > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (tga_width > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   if (!stbi__mad3sizes_valid(tga_width, tga_height, tga_comp, 0))
      return stbi__errpuc("too large", "Corrupt TGA");

   tga_data = (unsigned char*)stbi__malloc_mad3(tga_width, tga_height, tga_comp, 0);
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         if (tga_palette_len == 0) {  /* you have to have at least one entry! */
            STBI_FREE(tga_data);
            return stbi__errpuc("bad palette", "Corrupt TGA");
         }

         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc_mad2(tga_palette_len, tga_comp, 0);
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   STBI_NOTUSED(tga_palette_start);
   //   OK, done
   return tga_data;
}